

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O0

void __thiscall soplex::NameSet::NameSet(NameSet *this,int p_max,int mmax,Real fac,Real memFac)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  undefined4 in_ESI;
  DataSet<int> *in_RDI;
  undefined8 in_XMM0_Qa;
  DataSet<int> *in_XMM1_Qa;
  int local_50;
  DataSet<int> *this_00;
  int *hashfun;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffdc;
  undefined4 local_18;
  int n;
  
  this_00 = in_RDI;
  DataSet<int>::DataSet(in_XMM1_Qa,in_stack_ffffffffffffffdc);
  this_00[1].theitem = (Item *)0x0;
  hashfun = &this_00[1].themax;
  iVar2 = DataSet<int>::max(this_00);
  local_50 = in_EDX;
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::DataHashTable
            ((DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *)
             CONCAT44(in_stack_ffffffffffffffd4,iVar2),(_func_int_Name_ptr *)hashfun,
             (int)((ulong)this_00 >> 0x20),(int)this_00,(Real)in_RDI);
  uVar1 = in_XMM0_Qa;
  n = (int)((ulong)in_XMM0_Qa >> 0x20);
  in_RDI[9].themax = local_18;
  in_RDI[9].thesize = n;
  *(DataSet<int> **)&in_RDI[9].thenum = in_XMM1_Qa;
  *(undefined4 *)((long)&in_RDI[1].thekey + 4) = 0;
  in_XMM0_Qa = uVar1;
  iVar2 = local_50;
  if (local_50 < 1) {
    iVar3 = DataSet<int>::max(in_RDI);
    local_50 = iVar3 * 8 + 1;
  }
  *(int *)&in_RDI[1].thekey = local_50;
  n = (int)((ulong)in_XMM0_Qa >> 0x20);
  spx_alloc<char*>((char **)CONCAT44(in_ESI,iVar2),n);
  return;
}

Assistant:

NameSet::NameSet(int p_max, int mmax, Real fac, Real memFac)
   : set(p_max)
   , mem(nullptr)
   , hashtab(NameSetNameHashFunction, set.max(), 0, fac)
   , factor(fac)
   , memFactor(memFac)
{
   memused = 0;
   memmax = (mmax < 1) ? (8 * set.max() + 1) : mmax;
   spx_alloc(mem, memmax);
}